

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeNormal
          (ChVector<double> *__return_storage_ptr__,ChElementShellANCF_3833 *this,double xi,
          double eta)

{
  ChVector<double> r_zeta;
  VectorN Sxi_zeta_compact;
  Matrix3xN e_bar;
  Matrix3xN *local_3a8;
  VectorN *local_3a0;
  ChVector<double> local_398;
  VectorN local_380;
  Matrix3xN local_2c0;
  
  Calc_Sxi_zeta_compact(this,&local_380,xi,eta,0.0,this->m_thicknessZ,this->m_midsurfoffset);
  CalcCoordMatrix(this,&local_2c0);
  local_3a8 = &local_2c0;
  local_3a0 = &local_380;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,1,0,24,1>,0>>
            (&local_398,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_Eigen::Matrix<double,_24,_1,_0,_24,_1>,_0>_>
              *)&local_3a8,(type *)0x0);
  ChVector<double>::GetNormalized(__return_storage_ptr__,&local_398);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementShellANCF_3833::ComputeNormal(const double xi, const double eta) {
    VectorN Sxi_zeta_compact;
    Calc_Sxi_zeta_compact(Sxi_zeta_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // Calculate the position vector gradient with respect to zeta at the current point (whose length may not equal 1)
    ChVector<> r_zeta = e_bar * Sxi_zeta_compact;

    return r_zeta.GetNormalized();
}